

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::
       parse_align<char,fmt::v5::formatter<std::chrono::duration<long,std::ratio<1l,1000000l>>,char,void>::spec_handler&>
                 (char *begin,char *end,spec_handler *handler)

{
  bool bVar1;
  spec_handler *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char c;
  int i;
  alignment align;
  uint uVar2;
  alignment align_00;
  char *local_10;
  
  align_00 = ALIGN_DEFAULT;
  uVar2 = (uint)(in_RDI + 1 != in_RSI);
  while( true ) {
    switch(in_RDI[(int)uVar2]) {
    case '<':
      align_00 = ALIGN_LEFT;
      break;
    case '=':
      align_00 = ALIGN_NUMERIC;
      break;
    case '>':
      align_00 = ALIGN_RIGHT;
      break;
    case '^':
      align_00 = ALIGN_CENTER;
    }
    if (align_00 != ALIGN_DEFAULT) break;
    bVar1 = (int)uVar2 < 1;
    uVar2 = uVar2 - 1;
    if (bVar1) {
      return in_RDI;
    }
  }
  if ((int)uVar2 < 1) {
    local_10 = in_RDI + 1;
  }
  else {
    if (*in_RDI == '{') {
      formatter<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_char,_void>::spec_handler::
      on_error(in_RDX,(char *)CONCAT44(align_00,uVar2));
      return in_RDI;
    }
    local_10 = in_RDI + 2;
    formatter<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_char,_void>::spec_handler::
    on_fill(in_RDX,*in_RDI);
  }
  formatter<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_char,_void>::spec_handler::
  on_align(in_RDX,align_00);
  return local_10;
}

Assistant:

FMT_CONSTEXPR const Char *parse_align(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  alignment align = ALIGN_DEFAULT;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = ALIGN_LEFT;
      break;
    case '>':
      align = ALIGN_RIGHT;
      break;
    case '=':
      align = ALIGN_NUMERIC;
      break;
    case '^':
      align = ALIGN_CENTER;
      break;
    }
    if (align != ALIGN_DEFAULT) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}